

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro.c
# Opt level: O1

void coro_stack_free(coro_stack *stack)

{
  void *pvVar1;
  size_t sVar2;
  long lVar3;
  
  pvVar1 = stack->sptr;
  if (pvVar1 != (void *)0x0) {
    if (coro_pagesize_pagesize == 0) {
      coro_pagesize_pagesize = sysconf(0x1e);
    }
    lVar3 = coro_pagesize_pagesize * -4;
    sVar2 = stack->ssze;
    if (coro_pagesize_pagesize == 0) {
      coro_pagesize_pagesize = sysconf(0x1e);
    }
    munmap((void *)((long)pvVar1 + lVar3),sVar2 + coro_pagesize_pagesize * 4);
    return;
  }
  return;
}

Assistant:

void
coro_stack_free (struct coro_stack *stack)
{
#if CORO_FIBER
  /* nop */
#else
  #if CORO_USE_VALGRIND
    VALGRIND_STACK_DEREGISTER (stack->valgrind_id);
  #endif

  #if CORO_MMAP
    if (stack->sptr)
      munmap ((void*)((char *)stack->sptr - CORO_GUARDPAGES * PAGESIZE),
              stack->ssze                 + CORO_GUARDPAGES * PAGESIZE);
  #else
    free (stack->sptr);
  #endif
#endif
}